

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O3

void Wln_ObjAddFanin(Wln_Ntk_t *p,int iObj,int i)

{
  Wln_Vec_t *pWVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  
  pWVar1 = p->vFanins + iObj;
  uVar4 = p->vFanins[iObj].nSize;
  if ((long)(int)uVar4 < 2) {
    pWVar1->nSize = uVar4 + 1;
    *(int *)((long)&pWVar1->field_2 + (long)(int)uVar4 * 4) = i;
  }
  else if (uVar4 == 2) {
    piVar2 = (int *)malloc(0x10);
    *piVar2 = (pWVar1->field_2).Array[0];
    piVar2[1] = (pWVar1->field_2).Array[1];
    piVar2[2] = i;
    (pWVar1->field_2).pArray[0] = piVar2;
    pWVar1->nCap = 4;
    pWVar1->nSize = 3;
  }
  else {
    uVar3 = pWVar1->nCap;
    if (uVar4 == uVar3) {
      uVar3 = uVar4 * 2;
      pWVar1->nCap = uVar3;
      if ((pWVar1->field_2).pArray[0] == (int *)0x0) {
        piVar2 = (int *)malloc((ulong)uVar4 << 3);
      }
      else {
        piVar2 = (int *)realloc((pWVar1->field_2).pArray[0],(ulong)uVar4 << 3);
        uVar3 = pWVar1->nCap;
        uVar4 = pWVar1->nSize;
      }
      (pWVar1->field_2).pArray[0] = piVar2;
    }
    if ((int)uVar3 <= (int)uVar4) {
      __assert_fail("pVec->nSize < pVec->nCap",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnObj.c"
                    ,0x5e,"void Wln_ObjAddFanin(Wln_Ntk_t *, int, int)");
    }
    pWVar1->nSize = uVar4 + 1;
    (pWVar1->field_2).pArray[0][(int)uVar4] = i;
  }
  return;
}

Assistant:

void Wln_ObjAddFanin( Wln_Ntk_t * p, int iObj, int i )        
{ 
    Wln_Vec_t * pVec = p->vFanins + iObj;
    if ( Wln_ObjFaninNum(p, iObj) < 2 )
        pVec->Array[pVec->nSize++] = i;
    else if ( Wln_ObjFaninNum(p, iObj) == 2 )
    {
        int * pArray = ABC_ALLOC( int, 4 );
        pArray[0] = pVec->Array[0];
        pArray[1] = pVec->Array[1];
        pArray[2] = i;
        pVec->pArray[0] = pArray;
        pVec->nSize     = 3;
        pVec->nCap      = 4;
    }
    else 
    {
        if ( pVec->nSize == pVec->nCap )
            pVec->pArray[0] = ABC_REALLOC( int, pVec->pArray[0], (pVec->nCap = 2*pVec->nSize) ); 
        assert( pVec->nSize < pVec->nCap );
        pVec->pArray[0][pVec->nSize++] = i;
    }
}